

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCommitPhaseOne(Btree *p,char *zMaster)

{
  int *piVar1;
  BtShared *pBt;
  Pager *pPager;
  BtCursor *p_00;
  BtCursor *pBVar2;
  u8 *puVar3;
  uint uVar4;
  Pgno nFin;
  int iVar5;
  uint nOrig;
  bool bVar6;
  
  if (p->inTrans != '\x02') {
    return 0;
  }
  pBt = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if (pBt->autoVacuum != '\0') {
    pPager = pBt->pPager;
    p_00 = pBt->pCursor;
    for (pBVar2 = p_00; pBVar2 != (BtCursor *)0x0; pBVar2 = pBVar2->pNext) {
      pBVar2->curFlags = pBVar2->curFlags & 0xfb;
    }
    iVar5 = 0;
    if (pBt->incrVacuum == '\0') {
      nOrig = pBt->nPage;
      uVar4 = 0;
      if (1 < nOrig) {
        iVar5 = (nOrig - 2) - (nOrig - 2) % (pBt->usableSize / 5 + 1);
        uVar4 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
      if ((uVar4 == nOrig) || (nOrig == (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
        iVar5 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf75a,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      }
      else {
        uVar4 = *(uint *)(pBt->pPage1->aData + 0x24);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        nFin = finalDbSize(pBt,nOrig,uVar4);
        if (nOrig < nFin) {
          iVar5 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf75f,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        }
        else {
          iVar5 = 0;
          if ((p_00 != (BtCursor *)0x0) && (nFin < nOrig)) {
            iVar5 = saveCursorsOnList(p_00,0,(BtCursor *)0x0);
          }
          bVar6 = iVar5 == 0;
          if (nFin < nOrig && bVar6) {
            do {
              iVar5 = incrVacuumStep(pBt,nFin,nOrig,1);
              nOrig = nOrig - 1;
              bVar6 = iVar5 == 0;
              if (nOrig <= nFin) break;
            } while (iVar5 == 0);
          }
          if ((uVar4 != 0) && ((bool)(iVar5 == 0x65 | bVar6))) {
            iVar5 = sqlite3PagerWrite(pBt->pPage1->pDbPage);
            puVar3 = pBt->pPage1->aData;
            puVar3[0x20] = '\0';
            puVar3[0x21] = '\0';
            puVar3[0x22] = '\0';
            puVar3[0x23] = '\0';
            puVar3 = pBt->pPage1->aData;
            puVar3[0x24] = '\0';
            puVar3[0x25] = '\0';
            puVar3[0x26] = '\0';
            puVar3[0x27] = '\0';
            *(Pgno *)(pBt->pPage1->aData + 0x1c) =
                 nFin >> 0x18 | (nFin & 0xff0000) >> 8 | (nFin & 0xff00) << 8 | nFin << 0x18;
            pBt->bDoTruncate = '\x01';
            pBt->nPage = nFin;
          }
          if (iVar5 != 0) {
            sqlite3PagerRollback(pPager);
          }
        }
      }
    }
    if (iVar5 != 0) goto LAB_00118449;
  }
  if (pBt->bDoTruncate != '\0') {
    pBt->pPager->dbSize = pBt->nPage;
  }
  iVar5 = sqlite3PagerCommitPhaseOne(pBt->pPager,zMaster,0);
LAB_00118449:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCommitPhaseOne(Btree *p, const char *zMaster){
  int rc = SQLITE_OK;
  if( p->inTrans==TRANS_WRITE ){
    BtShared *pBt = p->pBt;
    sqlite3BtreeEnter(p);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      rc = autoVacuumCommit(pBt);
      if( rc!=SQLITE_OK ){
        sqlite3BtreeLeave(p);
        return rc;
      }
    }
    if( pBt->bDoTruncate ){
      sqlite3PagerTruncateImage(pBt->pPager, pBt->nPage);
    }
#endif
    rc = sqlite3PagerCommitPhaseOne(pBt->pPager, zMaster, 0);
    sqlite3BtreeLeave(p);
  }
  return rc;
}